

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

sysbvm_tuple_t sysbvm_parser_parsePragmaList(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  char *errorMessage;
  size_t sVar6;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 != 0xf) {
    sVar2 = sysbvm_array_create(context,0);
    return sVar2;
  }
  sVar2 = sysbvm_orderedCollection_create(context);
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  do {
    if (iVar1 != 0xf) {
      sVar2 = sysbvm_orderedCollection_asArray(context,sVar2);
      return sVar2;
    }
    startIndex = state->tokenPosition;
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 == 0xf) {
      state->tokenPosition = state->tokenPosition + 1;
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 == 4) {
        sVar6 = state->tokenPosition;
        sVar3 = sysbvm_stringStream_create(context);
        sVar4 = sysbvm_orderedCollection_create(context);
        while (iVar1 = sysbvm_parser_lookKindAt(state,0), iVar1 == 4) {
          if (state->tokenPosition < state->tokenSequenceSize) {
            sVar5 = sysbvm_arraySlice_at(state->tokenSequence,state->tokenPosition);
          }
          else {
            sVar5 = 0;
          }
          sVar5 = sysbvm_token_getValue(sVar5);
          sysbvm_stringStream_nextPutString(context,sVar3,sVar5);
          state->tokenPosition = state->tokenPosition + 1;
          sVar5 = sysbvm_parser_parseUnaryExpression(context,state);
          sysbvm_orderedCollection_add(context,sVar4,sVar5);
        }
        sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                          (context,state->sourceCode,state->tokenSequence,sVar6,sVar6);
        sVar3 = sysbvm_stringStream_asSymbol(context,sVar3);
        sVar3 = sysbvm_astLiteralNode_create(context,sVar5,sVar3);
        sVar4 = sysbvm_orderedCollection_asArray(context,sVar4);
      }
      else {
        if (iVar1 != 2) {
          sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
          errorMessage = "Expected a valid pragma content.";
          goto LAB_0012e214;
        }
        sVar3 = sysbvm_parser_parseLiteralTokenValue(context,state);
        sVar4 = sysbvm_array_create(context,0);
      }
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 0x10) {
        sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
        errorMessage = "Expected a pragma end.";
        goto LAB_0012e214;
      }
      sVar6 = state->tokenPosition + 1;
      state->tokenPosition = sVar6;
      sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,startIndex,sVar6);
      sVar3 = sysbvm_astPragmaNode_create(context,sVar5,sVar3,sVar4);
    }
    else {
      sVar3 = sysbvm_parser_makeSourcePositionForParserState(context,state);
      errorMessage = "Expected a subscript left bracket.";
LAB_0012e214:
      sVar3 = sysbvm_astErrorNode_createWithCString(context,sVar3,errorMessage);
    }
    sysbvm_orderedCollection_add(context,sVar2,sVar3);
    iVar1 = sysbvm_parser_lookKindAt(state,0);
  } while( true );
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parsePragmaList(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_LESS_THAN)
        return sysbvm_array_create(context, 0);

    sysbvm_tuple_t list = sysbvm_orderedCollection_create(context);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_LESS_THAN)
    {
        sysbvm_tuple_t pragma = sysbvm_parser_parsePragma(context, state);
        sysbvm_orderedCollection_add(context, list, pragma);
    }

    return sysbvm_orderedCollection_asArray(context, list);
}